

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O0

void __thiscall
cppcms::url_dispatcher::assign(url_dispatcher *this,string *expr,handler3 *h,int p1,int p2,int p3)

{
  ulong uVar1;
  string *in_RSI;
  hold_ptr<cppcms::url_dispatcher::_data> *in_RDI;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *unaff_retaddr;
  string *in_stack_00000008;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff74;
  string local_58 [76];
  
  unique0x10000133 = in_RSI;
  booster::hold_ptr<cppcms::url_dispatcher::_data>::operator->(in_RDI);
  std::__cxx11::string::string(local_58,stack0xfffffffffffffff0);
  uVar3 = 0;
  uVar2 = 0;
  uVar1 = (ulong)stack0xfffffffffffffff0 >> 0x20;
  (anonymous_namespace)::
  make_handler<std::function<void(std::__cxx11::string,std::__cxx11::string,std::__cxx11::string)>>
            (in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)uVar1,
             in_stack_00000020,in_stack_00000028,in_stack_00000030);
  std::
  vector<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
  ::push_back((vector<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
               *)CONCAT44(in_stack_ffffffffffffff74,uVar3),
              (value_type *)CONCAT44(in_stack_ffffffffffffff6c,uVar2));
  std::shared_ptr<cppcms::(anonymous_namespace)::option>::~shared_ptr
            ((shared_ptr<cppcms::(anonymous_namespace)::option> *)0x3b47a5);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void url_dispatcher::assign(std::string const &expr,handler3 h,int p1,int p2,int p3)
	{
		d->options.push_back(make_handler(expr,h,p1,p2,p3));
	}